

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall kpeg::TeeBuf::TeeBuf(TeeBuf *this,streambuf *sb1,streambuf *sb2)

{
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__streambuf_00134cd0;
  this->m_sb1 = sb1;
  this->m_sb2 = sb2;
  return;
}

Assistant:

TeeBuf::TeeBuf(std::streambuf * sb1, std::streambuf * sb2) :
        m_sb1(sb1),
        m_sb2(sb2)
    {}